

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

void empty_closedir_cb(uv_fs_t *req)

{
  char *pcVar1;
  undefined8 uStack_10;
  
  if (req == &closedir_req) {
    if (closedir_req.fs_type == UV_FS_CLOSEDIR) {
      if (closedir_req.result == 0) {
        empty_closedir_cb_count = empty_closedir_cb_count + 1;
        uv_fs_req_cleanup(&closedir_req);
        return;
      }
      pcVar1 = "req->result == 0";
      uStack_10 = 0x34;
    }
    else {
      pcVar1 = "req->fs_type == UV_FS_CLOSEDIR";
      uStack_10 = 0x33;
    }
  }
  else {
    pcVar1 = "req == &closedir_req";
    uStack_10 = 0x32;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
          ,uStack_10,pcVar1);
  abort();
}

Assistant:

static void empty_closedir_cb(uv_fs_t* req) {
  ASSERT(req == &closedir_req);
  ASSERT(req->fs_type == UV_FS_CLOSEDIR);
  ASSERT(req->result == 0);
  ++empty_closedir_cb_count;
  uv_fs_req_cleanup(req);
}